

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io_tests.cpp
# Opt level: O2

void key_io_tests::key_io_valid_parse_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_wrap_stringstream<char> *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  pointer local_690;
  pointer local_688;
  char *local_680;
  char *local_678;
  pointer local_670;
  pointer local_668;
  char *local_660;
  char *local_658;
  pointer local_650;
  pointer local_648;
  char *local_640;
  char *local_638;
  pointer local_630;
  pointer local_628;
  char *local_620;
  char *local_618;
  pointer local_610;
  pointer local_608;
  char *local_600;
  char *local_5f8;
  basic_wrap_stringstream<char> local_5f0;
  key_io_valid_parse t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_600 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_io_tests.cpp";
  local_5f8 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"key_io_valid_parse");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_610 = (pbVar3->_M_dataplus)._M_p;
  local_608 = local_610 + pbVar3->_M_string_length;
  file.m_end = (iterator)0x18;
  file.m_begin = (iterator)&local_600;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_610,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  key_io_valid_parse::key_io_valid_parse(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_io_tests.cpp";
  local_618 = "";
  memset(&local_5f0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f0);
  std::operator<<((ostream *)&local_5f0,'\"');
  std::operator<<((ostream *)&local_5f0,"key_io_valid_parse");
  std::operator<<((ostream *)&local_5f0,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f0);
  local_630 = (pbVar3->_M_dataplus)._M_p;
  local_628 = local_630 + pbVar3->_M_string_length;
  file_00.m_end = (iterator)0x18;
  file_00.m_begin = (iterator)&local_620;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_630,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_5f0);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_io_tests.cpp";
  local_638 = "";
  memset(&local_5f0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f0);
  std::operator<<((ostream *)&local_5f0,'\"');
  std::operator<<((ostream *)&local_5f0,"key_io_valid_parse");
  std::operator<<((ostream *)&local_5f0,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f0);
  local_650 = (pbVar3->_M_dataplus)._M_p;
  local_648 = local_650 + pbVar3->_M_string_length;
  file_01.m_end = (iterator)0x18;
  file_01.m_begin = (iterator)&local_640;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_650,msg_01);
  this = &local_5f0;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  key_io_valid_parse::test_method((key_io_valid_parse *)this);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_io_tests.cpp";
  local_658 = "";
  memset(&local_5f0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f0);
  std::operator<<((ostream *)&local_5f0,'\"');
  std::operator<<((ostream *)&local_5f0,"key_io_valid_parse");
  std::operator<<((ostream *)&local_5f0,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f0);
  local_670 = (pbVar3->_M_dataplus)._M_p;
  local_668 = local_670 + pbVar3->_M_string_length;
  file_02.m_end = (iterator)0x18;
  file_02.m_begin = (iterator)&local_660;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_670,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_5f0);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/key_io_tests.cpp";
  local_678 = "";
  memset(&local_5f0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f0);
  std::operator<<((ostream *)&local_5f0,'\"');
  std::operator<<((ostream *)&local_5f0,"key_io_valid_parse");
  std::operator<<((ostream *)&local_5f0,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f0);
  local_690 = (pbVar3->_M_dataplus)._M_p;
  local_688 = local_690 + pbVar3->_M_string_length;
  file_03.m_end = (iterator)0x18;
  file_03.m_begin = (iterator)&local_680;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_690,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_5f0);
  BasicTestingSetup::~BasicTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(key_io_valid_parse)
{
    UniValue tests = read_json(json_tests::key_io_valid);
    CKey privkey;
    CTxDestination destination;
    SelectParams(ChainType::MAIN);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        if (test.size() < 3) { // Allow for extra stuff (useful for comments)
            BOOST_ERROR("Bad test: " << strTest);
            continue;
        }
        std::string exp_base58string = test[0].get_str();
        const std::vector<std::byte> exp_payload{ParseHex<std::byte>(test[1].get_str())};
        const UniValue &metadata = test[2].get_obj();
        bool isPrivkey = metadata.find_value("isPrivkey").get_bool();
        SelectParams(ChainTypeFromString(metadata.find_value("chain").get_str()).value());
        bool try_case_flip = metadata.find_value("tryCaseFlip").isNull() ? false : metadata.find_value("tryCaseFlip").get_bool();
        if (isPrivkey) {
            bool isCompressed = metadata.find_value("isCompressed").get_bool();
            // Must be valid private key
            privkey = DecodeSecret(exp_base58string);
            BOOST_CHECK_MESSAGE(privkey.IsValid(), "!IsValid:" + strTest);
            BOOST_CHECK_MESSAGE(privkey.IsCompressed() == isCompressed, "compressed mismatch:" + strTest);
            BOOST_CHECK_MESSAGE(std::ranges::equal(privkey, exp_payload), "key mismatch:" + strTest);

            // Private key must be invalid public key
            destination = DecodeDestination(exp_base58string);
            BOOST_CHECK_MESSAGE(!IsValidDestination(destination), "IsValid privkey as pubkey:" + strTest);
        } else {
            // Must be valid public key
            destination = DecodeDestination(exp_base58string);
            CScript script = GetScriptForDestination(destination);
            BOOST_CHECK_MESSAGE(IsValidDestination(destination), "!IsValid:" + strTest);
            BOOST_CHECK_EQUAL(HexStr(script), HexStr(exp_payload));

            // Try flipped case version
            for (char& c : exp_base58string) {
                if (c >= 'a' && c <= 'z') {
                    c = (c - 'a') + 'A';
                } else if (c >= 'A' && c <= 'Z') {
                    c = (c - 'A') + 'a';
                }
            }
            destination = DecodeDestination(exp_base58string);
            BOOST_CHECK_MESSAGE(IsValidDestination(destination) == try_case_flip, "!IsValid case flipped:" + strTest);
            if (IsValidDestination(destination)) {
                script = GetScriptForDestination(destination);
                BOOST_CHECK_EQUAL(HexStr(script), HexStr(exp_payload));
            }

            // Public key must be invalid private key
            privkey = DecodeSecret(exp_base58string);
            BOOST_CHECK_MESSAGE(!privkey.IsValid(), "IsValid pubkey as privkey:" + strTest);
        }
    }
}